

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

int __thiscall crnlib::mipmapped_texture::init(mipmapped_texture *this,EVP_PKEY_CTX *ctx)

{
  component_flags cVar1;
  uint uVar2;
  int iVar3;
  dxt_format dVar4;
  ulong uVar5;
  ulong extraout_RAX;
  mip_level *pmVar6;
  dxt_image *this_00;
  ulong extraout_RAX_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  ulong extraout_RAX_01;
  uint in_ECX;
  uint in_EDX;
  uint *init1;
  ulong uVar7;
  uint in_R8D;
  pixel_format in_R9D;
  uint l;
  ulong uVar8;
  char *in_stack_00000008;
  orientation_flags_t in_stack_00000010;
  uint mip_height;
  uint mip_width;
  uint local_50;
  uint local_4c;
  face_vec *local_48;
  ulong local_40;
  ulong local_38;
  
  clear(this);
  local_50 = (uint)ctx;
  this->m_width = local_50;
  this->m_height = in_EDX;
  local_4c = in_EDX;
  cVar1 = pixel_format_helpers::get_component_flags(in_R9D);
  this->m_comp_flags = cVar1;
  this->m_format = in_R9D;
  if (in_stack_00000008 != (char *)0x0) {
    dynamic_string::set(&this->m_name,in_stack_00000008,0xffffffff);
  }
  local_48 = &this->m_faces;
  vector<crnlib::vector<crnlib::mip_level_*>_>::resize(local_48,in_R8D,false);
  uVar5 = (ulong)in_R8D;
  uVar7 = 0;
  local_40 = uVar5;
  while (uVar7 != local_40) {
    local_38 = uVar7;
    vector<crnlib::mip_level_*>::resize(local_48->m_p + uVar7,in_ECX,false);
    uVar5 = extraout_RAX;
    for (uVar8 = 0; in_ECX != uVar8; uVar8 = uVar8 + 1) {
      pmVar6 = crnlib_new<crnlib::mip_level>();
      local_48->m_p[uVar7].m_p[uVar8] = pmVar6;
      uVar2 = local_50 >> ((byte)uVar8 & 0x1f);
      mip_width = uVar2 + (uVar2 == 0);
      uVar2 = local_4c >> ((byte)uVar8 & 0x1f);
      mip_height = uVar2 + (uVar2 == 0);
      iVar3 = pixel_format_helpers::is_dxt(in_R9D);
      if (iVar3 == 0) {
        p = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                      ((crnlib *)&mip_width,&mip_height,init1);
        p->m_comp_flags = this->m_comp_flags;
        mip_level::assign((this->m_faces).m_p[uVar7].m_p[uVar8],p,this->m_format,in_stack_00000010);
        uVar5 = extraout_RAX_01;
      }
      else {
        this_00 = crnlib_new<crnlib::dxt_image>();
        dVar4 = pixel_format_helpers::get_dxt_format(in_R9D);
        dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar4);
        mip_level::assign((this->m_faces).m_p[uVar7].m_p[uVar8],this_00,this->m_format,
                          in_stack_00000010);
        uVar5 = extraout_RAX_00;
      }
    }
    uVar7 = local_38 + 1;
  }
  return (int)uVar5;
}

Assistant:

void mipmapped_texture::init(uint width, uint height, uint levels, uint faces, pixel_format fmt, const char* pName, orientation_flags_t orient_flags) {
  clear();

  CRNLIB_ASSERT((width > 0) && (height > 0) && (levels > 0));
  CRNLIB_ASSERT((faces == 1) || (faces == 6));

  m_width = width;
  m_height = height;
  m_comp_flags = pixel_format_helpers::get_component_flags(fmt);
  m_format = fmt;
  if (pName)
    m_name.set(pName);

  m_faces.resize(faces);
  for (uint f = 0; f < faces; f++) {
    m_faces[f].resize(levels);
    for (uint l = 0; l < levels; l++) {
      m_faces[f][l] = crnlib_new<mip_level>();

      const uint mip_width = math::maximum(1U, width >> l);
      const uint mip_height = math::maximum(1U, height >> l);
      if (pixel_format_helpers::is_dxt(fmt)) {
        dxt_image* p = crnlib_new<dxt_image>();
        p->init(pixel_format_helpers::get_dxt_format(fmt), mip_width, mip_height, true);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      } else {
        image_u8* p = crnlib_new<image_u8>(mip_width, mip_height);
        p->set_comp_flags(m_comp_flags);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      }
    }
  }

  CRNLIB_ASSERT(check());
}